

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChISO2631_5_Wz::Filter
          (ChISO2631_5_Wz *this,vector<double,_std::allocator<double>_> *u,
          vector<double,_std::allocator<double>_> *y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pdVar4;
  bool bVar5;
  ulong *puVar6;
  pointer pdVar7;
  long lVar8;
  size_t __n;
  ulong uVar9;
  ulong *puVar10;
  int j;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  pointer pdVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  ChMatrixDynamic<> x;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  DenseStorage<double,__1,__1,__1,_1> local_58;
  long local_38;
  
  local_70 = (undefined8 *)::operator_new(0x40);
  local_68 = local_70 + 8;
  *local_70 = 0;
  local_70[1] = 0;
  local_70[2] = 0;
  local_70[3] = 0;
  local_70[4] = 0;
  local_70[5] = 0;
  local_70[6] = 0;
  local_70[7] = 0;
  local_60 = local_68;
  std::vector<double,std::allocator<double>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((vector<double,std::allocator<double>> *)&local_70,local_68,
             (u->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (u->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  uVar9 = (long)local_68 - (long)local_70;
  local_58.m_data = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (y,(long)uVar9 >> 3,(value_type_conflict1 *)&local_58);
  local_58.m_cols = 0;
  lVar8 = (long)(int)(uVar9 >> 3);
  local_58.m_data = (double *)0x0;
  local_58.m_rows = 0;
  if (lVar8 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_58,lVar8 * 7,lVar8,7);
  if (0x40 < (ulong)((long)local_68 - (long)local_70)) {
    lVar14 = 0x38;
    lVar8 = 0x40;
    lVar13 = 0;
    uVar9 = 9;
    do {
      puVar10 = &m_w;
      lVar11 = 1;
      local_38 = lVar8;
      do {
        auVar17 = ZEXT816(0) << 0x40;
        lVar8 = 7;
        puVar6 = puVar10;
        do {
          auVar18._8_8_ = 0;
          auVar18._0_8_ =
               *(ulong *)((long)(y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar8 * 8 + lVar13);
          lVar8 = lVar8 + -1;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *puVar6;
          auVar17 = vfmadd231sd_fma(auVar17,auVar18,auVar1);
          puVar6 = puVar6 + 7;
        } while (lVar8 != 3);
        auVar20 = ZEXT864(0);
        lVar8 = 0x1c;
        puVar6 = (ulong *)((long)local_70 + lVar14);
        do {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *puVar6;
          puVar6 = puVar6 + -1;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = puVar10[lVar8];
          auVar1 = vfmadd231sd_fma(auVar20._0_16_,auVar21,auVar2);
          auVar20 = ZEXT1664(auVar1);
          lVar8 = lVar8 + 7;
        } while (lVar8 != 0x54);
        dVar16 = tanh(auVar17._0_8_ + auVar1._0_8_ + *(double *)(&UNK_009f3a88 + lVar11 * 8));
        if ((local_58.m_rows < (long)uVar9) || (local_58.m_cols < lVar11)) goto LAB_00927675;
        puVar10 = puVar10 + 1;
        local_58.m_data[local_58.m_cols * (uVar9 - 1) + lVar11 + -1] = dVar16;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
      pdVar4 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar17 = ZEXT816(0);
      uVar12 = 0;
      pdVar4[uVar9 - 1] = 0.0;
      do {
        if ((~(local_58.m_cols >> 0x3f) & local_58.m_cols) == uVar12) {
LAB_00927675:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                       );
        }
        auVar19._8_8_ = 0;
        auVar19._0_8_ = (&m_W)[uVar12];
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *(ulong *)((long)local_58.m_data + uVar12 * 8 + local_58.m_cols * local_38);
        auVar17 = vfmadd231sd_fma(auVar17,auVar19,auVar3);
        uVar12 = uVar12 + 1;
        pdVar4[uVar9 - 1] = auVar17._0_8_;
      } while (uVar12 != 7);
      lVar13 = lVar13 + 8;
      lVar14 = lVar14 + 8;
      lVar8 = local_38 + 8;
      pdVar4[uVar9 - 1] = auVar17._0_8_ + 21.51959;
      bVar5 = uVar9 < (ulong)((long)local_68 - (long)local_70 >> 3);
      uVar9 = uVar9 + 1;
    } while (bVar5);
  }
  pdVar15 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  pdVar4 = pdVar15 + 8;
  __n = (long)(y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pdVar4;
  pdVar7 = pdVar4;
  if (__n != 0) {
    memmove(pdVar15,pdVar4,__n);
    pdVar7 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  pdVar15 = (pointer)((long)pdVar15 + ((long)pdVar7 - (long)pdVar4));
  if (pdVar7 != pdVar15) {
    (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar15;
  }
  if (local_58.m_data != (double *)0x0) {
    free((void *)local_58.m_data[-1]);
  }
  if (local_70 != (undefined8 *)0x0) {
    operator_delete(local_70,(long)local_60 - (long)local_70);
  }
  return;
}

Assistant:

void ChISO2631_5_Wz::Filter(std::vector<double>& u, std::vector<double>& y) {
    std::vector<double> asz(8);
    asz.insert(asz.end(), u.begin(), u.end());
    int asz_size = static_cast<int>(asz.size());
    y.resize(asz.size(), 0.0);
    ChMatrixDynamic<> x(asz_size, 7);
    // indices run from 1 to N to make it compatible to Matlab
    for (int t = 9; t <= asz.size(); t++) {
        for (int j = 1; j <= 7; j++) {
            double S1 = 0.0;
            for (int k = 1; k <= 4; k++) {
                S1 += y[t - k - 1] * m_w[k - 1][j - 1];
            }
            double S2 = 0.0;
            int kk = 1;
            for (int k = 5; k <= 12; k++) {
                S2 += asz[t - kk - 1] * m_w[k - 1][j - 1];
                kk++;
            }
            x(t - 1, j - 1) = tanh(S1 + S2 + m_w[12][j - 1]);
        }
        y[t - 1] = 0.0;
        for (int k = 1; k <= 7; k++) {
            y[t - 1] += m_W[k - 1] * x(t - 1, k - 1);
        }
        y[t - 1] += m_W[7];
    }
    y.erase(y.begin(), y.begin() + 8);  // get rid of leading zeros
}